

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int lua_setfenv(lua_State *L,int idx)

{
  byte bVar1;
  StkId pTVar2;
  GCObject *pGVar3;
  global_State *g;
  bool bVar4;
  int iVar5;
  
  pTVar2 = L->top;
  iVar5 = pTVar2[-2].tt;
  if (iVar5 == 8) {
    pGVar3 = pTVar2[-2].value.gc;
    (pGVar3->th).l_gt.value = pTVar2[-1].value;
    (pGVar3->th).l_gt.tt = 5;
  }
  else {
    if ((iVar5 != 7) && (iVar5 != 6)) {
      iVar5 = 0;
      bVar4 = true;
      goto LAB_0010f95e;
    }
    ((pTVar2[-2].value.gc)->h).array = (TValue *)pTVar2[-1].value;
  }
  iVar5 = 1;
  bVar4 = false;
LAB_0010f95e:
  if ((!bVar4) && (pGVar3 = L->top[-1].value.gc, ((pGVar3->gch).marked & 3) != 0)) {
    bVar1 = ((pTVar2[-2].value.gc)->gch).marked;
    if ((bVar1 & 4) != 0) {
      g = L->l_G;
      if (g->gcstate == '\x01') {
        reallymarkobject(g,pGVar3);
      }
      else {
        ((pTVar2[-2].value.gc)->gch).marked = g->currentwhite & 3 | bVar1 & 0xf8;
      }
    }
  }
  L->top = L->top + -1;
  return iVar5;
}

Assistant:

static int lua_setfenv(lua_State*L,int idx){
StkId o;
int res=1;
api_checknelems(L,1);
o=index2adr(L,idx);
api_checkvalidindex(L,o);
luai_apicheck(L,ttistable(L->top-1));
switch(ttype(o)){
case 6:
clvalue(o)->c.env=hvalue(L->top-1);
break;
case 7:
uvalue(o)->env=hvalue(L->top-1);
break;
case 8:
sethvalue(L,gt(thvalue(o)),hvalue(L->top-1));
break;
default:
res=0;
break;
}
if(res)luaC_objbarrier(L,gcvalue(o),hvalue(L->top-1));
L->top--;
return res;
}